

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O1

void __thiscall csm::Plugin::Plugin(Plugin *this)

{
  undefined8 *puVar1;
  pthread_mutex_t *__mutex;
  _List_node_base *p_Var2;
  
  this->_vptr_Plugin = (_func_int **)&PTR__Plugin_001247d8;
  if (theList_abi_cxx11_ == (undefined8 *)0x0) {
    theList_abi_cxx11_ = (undefined8 *)operator_new(0x18);
    *theList_abi_cxx11_ = 0;
    theList_abi_cxx11_[1] = 0;
    theList_abi_cxx11_[2] = 0;
    theList_abi_cxx11_[1] = theList_abi_cxx11_;
    *theList_abi_cxx11_ = theList_abi_cxx11_;
  }
  if (theList_abi_cxx11_ != (undefined8 *)0x0) {
    __mutex = (pthread_mutex_t *)impl();
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    puVar1 = theList_abi_cxx11_;
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)this;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    puVar1[2] = puVar1[2] + 1;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
      return;
    }
  }
  return;
}

Assistant:

Plugin::Plugin()
{
   //---
   // If the list of registered sensor model factories does not exist yet, then
   // create it.
   //---
   if (!theList) theList = new PluginList();

   //---
   // If the list of registered sensor model factories exists now (i.e., no
   // error occurred while creating it), then register the plugin factory in
   // theList by adding a pointer to this list.
   //    The pointer points to the static instance of the derived sensor
   // model plugin.
   //---
   if (theList)
   {
      Impl::Locker locker(impl());

      theList->push_back(this);
   }
}